

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::NetAlias>::emplaceRealloc<slang::ast::NetAlias>
          (SmallVectorBase<slang::ast::NetAlias> *this,pointer pos,NetAlias *args)

{
  unsigned_long *puVar1;
  ulong uVar2;
  pointer p;
  ValueSymbol *pVVar3;
  Expression *pEVar4;
  unsigned_long uVar5;
  pointer pNVar6;
  pointer pNVar7;
  pointer pNVar8;
  long lVar9;
  long lVar10;
  size_type sVar11;
  ulong uVar12;
  
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar12 = this->len + 1;
  uVar2 = this->cap;
  if (uVar12 < uVar2 * 2) {
    uVar12 = uVar2 * 2;
  }
  if (0x3ffffffffffffff - uVar2 < uVar2) {
    uVar12 = 0x3ffffffffffffff;
  }
  lVar10 = (long)pos - (long)this->data_;
  pNVar6 = (pointer)operator_new(uVar12 << 5);
  pVVar3 = (args->sym).ptr;
  pEVar4 = (args->expr).ptr;
  uVar5 = (args->bounds).second;
  puVar1 = (unsigned_long *)((long)pNVar6 + lVar10 + 0x10);
  *puVar1 = (args->bounds).first;
  puVar1[1] = uVar5;
  *(undefined8 *)((long)pNVar6 + lVar10) = pVVar3;
  ((undefined8 *)((long)pNVar6 + lVar10))[1] = pEVar4;
  p = this->data_;
  sVar11 = this->len;
  lVar9 = (long)p + (sVar11 * 0x20 - (long)pos);
  pNVar7 = p;
  pNVar8 = pNVar6;
  if (lVar9 == 0) {
    pNVar7 = pNVar6;
    pNVar8 = p;
    if (sVar11 != 0) {
      do {
        pVVar3 = (pNVar8->sym).ptr;
        pEVar4 = (pNVar8->expr).ptr;
        uVar5 = (pNVar8->bounds).second;
        (pNVar7->bounds).first = (pNVar8->bounds).first;
        (pNVar7->bounds).second = uVar5;
        (pNVar7->sym).ptr = pVVar3;
        (pNVar7->expr).ptr = pEVar4;
        pNVar8 = pNVar8 + 1;
        pNVar7 = pNVar7 + 1;
      } while (pNVar8 != pos);
    }
  }
  else {
    for (; pNVar7 != pos; pNVar7 = pNVar7 + 1) {
      pVVar3 = (pNVar7->sym).ptr;
      pEVar4 = (pNVar7->expr).ptr;
      uVar5 = (pNVar7->bounds).second;
      (pNVar8->bounds).first = (pNVar7->bounds).first;
      (pNVar8->bounds).second = uVar5;
      (pNVar8->sym).ptr = pVVar3;
      (pNVar8->expr).ptr = pEVar4;
      pNVar8 = pNVar8 + 1;
    }
    memcpy((void *)((long)pNVar6 + lVar10 + 0x20),pos,(lVar9 - 0x20U & 0xffffffffffffffe0) + 0x20);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar11 = this->len;
  }
  this->len = sVar11 + 1;
  this->cap = uVar12;
  this->data_ = pNVar6;
  return (pointer)((long)pNVar6 + lVar10);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}